

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O0

void __thiscall
pbrt::MLTIntegrator::MLTIntegrator
          (MLTIntegrator *this,CameraHandle *camera,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,int maxDepth,
          int nBootstrap,int nChains,int mutationsPerPixel,Float sigma,Float largeStepProbability,
          bool regularize)

{
  span<const_pbrt::LightHandle> lights_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *v;
  span<const_pbrt::LightHandle> *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  byte in_stack_00000018;
  undefined8 in_stack_000000c8;
  undefined4 in_stack_000000d4;
  PowerLightSampler *in_stack_ffffffffffffff38;
  PrimitiveHandle *in_stack_ffffffffffffff40;
  polymorphic_allocator<std::byte> *this_00;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff88;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffff90;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_ffffffffffffffb0;
  PrimitiveHandle *in_stack_ffffffffffffffb8;
  Integrator *in_stack_ffffffffffffffc0;
  
  PrimitiveHandle::PrimitiveHandle
            (in_stack_ffffffffffffff40,(PrimitiveHandle *)in_stack_ffffffffffffff38);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Integrator::Integrator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDX);
  *in_RDI = &PTR__MLTIntegrator_03748df8;
  this_00 = (polymorphic_allocator<std::byte> *)(in_RDI + 0xb);
  v = (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)operator_new(0x70);
  pstd::span<pbrt::LightHandle_const>::
  span<std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>,void,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>>
            (in_RDX,v);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(this_00);
  lights_00.n._0_4_ = nChains;
  lights_00.ptr = (LightHandle *)in_stack_000000c8;
  lights_00.n._4_4_ = in_stack_000000d4;
  PowerLightSampler::PowerLightSampler((PowerLightSampler *)camera,lights_00,(Allocator)this);
  LightSamplerHandle::TaggedPointer<pbrt::PowerLightSampler>
            ((LightSamplerHandle *)this_00,in_stack_ffffffffffffff38);
  *(byte *)(in_RDI + 0xc) = in_stack_00000018 & 1;
  CameraHandle::CameraHandle((CameraHandle *)this_00,(CameraHandle *)in_stack_ffffffffffffff38);
  *(undefined4 *)(in_RDI + 0xe) = in_R8D;
  *(undefined4 *)((long)in_RDI + 0x74) = in_R9D;
  *(undefined4 *)(in_RDI + 0xf) = in_stack_00000010;
  *(undefined4 *)((long)in_RDI + 0x7c) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x10) = in_XMM1_Da;
  *(undefined4 *)((long)in_RDI + 0x84) = in_stack_00000008;
  return;
}

Assistant:

MLTIntegrator(CameraHandle camera, PrimitiveHandle aggregate,
                  std::vector<LightHandle> lights, int maxDepth, int nBootstrap,
                  int nChains, int mutationsPerPixel, Float sigma,
                  Float largeStepProbability, bool regularize)
        : Integrator(aggregate, lights),
          lightSampler(new PowerLightSampler(lights, Allocator())),
          camera(camera),
          maxDepth(maxDepth),
          nBootstrap(nBootstrap),
          nChains(nChains),
          mutationsPerPixel(mutationsPerPixel),
          sigma(sigma),
          largeStepProbability(largeStepProbability),
          regularize(regularize) {}